

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O2

void __thiscall
Js::ByteCodeWriter::BrReg1Unsigned1
          (ByteCodeWriter *this,OpCode op,ByteCodeLabel labelID,RegSlot R1,uint C2)

{
  code *pcVar1;
  bool bVar2;
  RegSlot R1_00;
  undefined4 *puVar3;
  
  CheckOpen(this);
  CheckOp(this,op,(OpLayoutType)0x17);
  bVar2 = OpCodeAttr::HasMultiSizeLayout(op);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x34b,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar2) goto LAB_007cbde9;
    *puVar3 = 0;
  }
  CheckLabel(this,labelID);
  R1_00 = ConsumeReg(this,R1);
  bVar2 = TryWriteBrReg1Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>(this,op,labelID,R1_00,C2)
  ;
  if (!bVar2) {
    bVar2 = TryWriteBrReg1Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                      (this,op,labelID,R1_00,C2);
    if (!bVar2) {
      bVar2 = TryWriteBrReg1Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
                        (this,op,labelID,R1_00,C2);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                    ,0x350,"(success)","success");
        if (!bVar2) {
LAB_007cbde9:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar3 = 0;
      }
    }
  }
  return;
}

Assistant:

void ByteCodeWriter::BrReg1Unsigned1(OpCode op, ByteCodeLabel labelID, RegSlot R1, uint C2)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::BrReg1Unsigned1);
        Assert(OpCodeAttr::HasMultiSizeLayout(op));
        CheckLabel(labelID);

        R1 = ConsumeReg(R1);

        MULTISIZE_LAYOUT_WRITE(BrReg1Unsigned1, op, labelID, R1, C2);
    }